

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O3

void Ssw_SignalFilterGia(Gia_Man_t *p,int nFramesMax,int nConfMax,int nRounds,int TimeLimit,
                        int TimeLimit2,Abc_Cex_t *pCex,int fLatchOnly,int fVerbose)

{
  Aig_Man_t *pAig;
  
  pAig = Gia_ManToAigSimple(p);
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    Gia_ManReprToAigRepr2(pAig,p);
    if (p->pReprs != (Gia_Rpr_t *)0x0) {
      free(p->pReprs);
      p->pReprs = (Gia_Rpr_t *)0x0;
    }
    if (p->pNexts != (int *)0x0) {
      free(p->pNexts);
      p->pNexts = (int *)0x0;
    }
  }
  Ssw_SignalFilter(pAig,nFramesMax,nConfMax,nRounds,TimeLimit,TimeLimit2,pCex,fLatchOnly,fVerbose);
  Gia_ManReprFromAigRepr(pAig,p);
  Aig_ManStop(pAig);
  return;
}

Assistant:

void Ssw_SignalFilterGia( Gia_Man_t * p, int nFramesMax, int nConfMax, int nRounds, int TimeLimit, int TimeLimit2, Abc_Cex_t * pCex, int fLatchOnly, int fVerbose )
{
    Aig_Man_t * pAig;
    pAig = Gia_ManToAigSimple( p );
    if ( p->pReprs != NULL )
    {
        Gia_ManReprToAigRepr2( pAig, p );
        ABC_FREE( p->pReprs );
        ABC_FREE( p->pNexts );
    }
    Ssw_SignalFilter( pAig, nFramesMax, nConfMax, nRounds, TimeLimit, TimeLimit2, pCex, fLatchOnly, fVerbose );
    Gia_ManReprFromAigRepr( pAig, p );
    Aig_ManStop( pAig );
}